

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

bool_t MATROSKA_TrackSetCompressionNone(matroska_trackentry *TrackEntry)

{
  ebml_context *Context;
  ebml_element *p;
  bool_t bVar1;
  
  Context = MATROSKA_getContextContentEncodings();
  p = EBML_MasterFindFirstElt(&TrackEntry->Base,Context,0,0,0);
  bVar1 = Node_IsPartOf(TrackEntry,0x45544b4d);
  if (bVar1 == 0) {
    __assert_fail("Node_IsPartOf(TrackEntry, MATROSKA_TRACKENTRY_CLASS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x96e,"bool_t MATROSKA_TrackSetCompressionNone(matroska_trackentry *)");
  }
  if (p != (ebml_element *)0x0) {
    NodeDelete((node *)p);
  }
  return (ulong)(p != (ebml_element *)0x0);
}

Assistant:

bool_t MATROSKA_TrackSetCompressionNone(matroska_trackentry *TrackEntry)
{
    ebml_element *Encodings = EBML_MasterFindChild(TrackEntry,MATROSKA_getContextContentEncodings());
    assert(Node_IsPartOf(TrackEntry, MATROSKA_TRACKENTRY_CLASS));
    if (!Encodings)
        return 0;
    NodeDelete((node*)Encodings);
    return 1;
}